

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O3

void __thiscall Ring<bool>::next(Ring<bool> *this,bool d)

{
  uint uVar1;
  bool *pbVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = this->ringSize;
  if (this->ringDelayedAdd != false) {
    if (0 < (int)uVar1) {
      pbVar2 = this->ringData;
      uVar4 = 0;
      do {
        pbVar2[uVar4] = (bool)(pbVar2[uVar4] | this->ringDelayedAdd);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    this->ringDelayedAdd = false;
  }
  this->ringCacheInvalid = true;
  iVar3 = this->ringCurrentIndex + 1;
  this->ringCurrentIndex = iVar3;
  if ((int)uVar1 <= iVar3) {
    this->ringCurrentIndex = 0;
    this->ringIsInitialised = true;
    iVar3 = 0;
  }
  this->ringData[iVar3] = d;
  return;
}

Assistant:

void flush() const {
        if (ringDelayedAdd != 0.0) {
            for(int i=0; i<ringSize; i++) {
                ringData[i] += ringDelayedAdd;
            }
            ringDelayedAdd = 0.0;
        }
    }